

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msaa.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  double dVar2;
  double angle;
  mat4x4 mvp;
  mat4x4 p;
  mat4x4 m;
  int local_4c;
  int local_48;
  int height;
  int width;
  float ratio;
  GLint vpos_location;
  GLint mvp_location;
  GLuint program;
  GLuint fragment_shader;
  GLuint vertex_shader;
  GLuint vertex_buffer;
  GLFWwindow *window;
  int samples;
  int ch;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  window._0_4_ = 4;
  _samples = argv;
  argv_local._0_4_ = argc;
  while( true ) {
    window._4_4_ = getopt((int)argv_local,_samples,"hs:");
    if (window._4_4_ == -1) {
      glfwSetErrorCallback(error_callback);
      iVar1 = glfwInit();
      if (iVar1 == 0) {
        exit(1);
      }
      if ((uint)window == 0) {
        printf("Requesting that MSAA not be available\n");
      }
      else {
        printf("Requesting MSAA with %i samples\n",(ulong)(uint)window);
      }
      glfwWindowHint(0x2100d,(uint)window);
      glfwWindowHint(0x22002,2);
      glfwWindowHint(0x22003,0);
      _vertex_shader =
           glfwCreateWindow(800,400,"Aliasing Detector",(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
      if (_vertex_shader == (GLFWwindow *)0x0) {
        glfwTerminate();
        exit(1);
      }
      glfwSetKeyCallback(_vertex_shader,key_callback);
      glfwMakeContextCurrent(_vertex_shader);
      gladLoadGL(glfwGetProcAddress);
      glfwSwapInterval(1);
      (*glad_glGetIntegerv)(0x80a9,(GLint *)&window);
      if ((uint)window == 0) {
        printf("Context reports MSAA is unavailable\n");
      }
      else {
        printf("Context reports MSAA is available with %i samples\n",(ulong)(uint)window);
      }
      (*glad_glGenBuffers)(1,&fragment_shader);
      (*glad_glBindBuffer)(0x8892,fragment_shader);
      (*glad_glBufferData)(0x8892,0x20,vertices,0x88e4);
      program = (*glad_glCreateShader)(0x8b31);
      (*glad_glShaderSource)(program,1,&vertex_shader_text,(GLint *)0x0);
      (*glad_glCompileShader)(program);
      mvp_location = (*glad_glCreateShader)(0x8b30);
      (*glad_glShaderSource)(mvp_location,1,&fragment_shader_text,(GLint *)0x0);
      (*glad_glCompileShader)(mvp_location);
      vpos_location = (*glad_glCreateProgram)();
      (*glad_glAttachShader)(vpos_location,program);
      (*glad_glAttachShader)(vpos_location,mvp_location);
      (*glad_glLinkProgram)(vpos_location);
      ratio = (float)(*glad_glGetUniformLocation)(vpos_location,"MVP");
      width = (*glad_glGetAttribLocation)(vpos_location,"vPos");
      (*glad_glEnableVertexAttribArray)(width);
      (*glad_glVertexAttribPointer)(width,2,0x1406,'\0',8,(void *)0x0);
      while( true ) {
        iVar1 = glfwWindowShouldClose(_vertex_shader);
        if (iVar1 != 0) break;
        dVar2 = glfwGetTime();
        dVar2 = (dVar2 * 3.141592653589793) / 180.0;
        glfwGetFramebufferSize(_vertex_shader,&local_48,&local_4c);
        height = (int)((float)local_48 / (float)local_4c);
        (*glad_glViewport)(0,0,local_48,local_4c);
        (*glad_glClear)(0x4000);
        (*glad_glUseProgram)(vpos_location);
        mat4x4_ortho((vec4 *)(mvp[3] + 2),-(float)height,(float)height,-1.0,1.0,0.0,1.0);
        mat4x4_translate((vec4 *)(p[3] + 2),-1.0,0.0,0.0);
        mat4x4_rotate_Z((vec4 *)(p[3] + 2),(vec4 *)(p[3] + 2),(float)dVar2);
        mat4x4_mul((vec4 *)&angle,(vec4 *)(mvp[3] + 2),(vec4 *)(p[3] + 2));
        (*glad_glUniformMatrix4fv)((GLint)ratio,1,'\0',(GLfloat *)&angle);
        (*glad_glDisable)(0x809d);
        (*glad_glDrawArrays)(6,0,4);
        mat4x4_translate((vec4 *)(p[3] + 2),1.0,0.0,0.0);
        mat4x4_rotate_Z((vec4 *)(p[3] + 2),(vec4 *)(p[3] + 2),(float)dVar2);
        mat4x4_mul((vec4 *)&angle,(vec4 *)(mvp[3] + 2),(vec4 *)(p[3] + 2));
        (*glad_glUniformMatrix4fv)((GLint)ratio,1,'\0',(GLfloat *)&angle);
        (*glad_glEnable)(0x809d);
        (*glad_glDrawArrays)(6,0,4);
        glfwSwapBuffers(_vertex_shader);
        glfwPollEvents();
      }
      glfwDestroyWindow(_vertex_shader);
      glfwTerminate();
      exit(0);
    }
    if (window._4_4_ == 0x68) {
      usage();
      exit(0);
    }
    if (window._4_4_ != 0x73) break;
    window._0_4_ = atoi(optarg);
  }
  usage();
  exit(1);
}

Assistant:

int main(int argc, char** argv)
{
    int ch, samples = 4;
    GLFWwindow* window;
    GLuint vertex_buffer, vertex_shader, fragment_shader, program;
    GLint mvp_location, vpos_location;

    while ((ch = getopt(argc, argv, "hs:")) != -1)
    {
        switch (ch)
        {
            case 'h':
                usage();
                exit(EXIT_SUCCESS);
            case 's':
                samples = atoi(optarg);
                break;
            default:
                usage();
                exit(EXIT_FAILURE);
        }
    }

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    if (samples)
        printf("Requesting MSAA with %i samples\n", samples);
    else
        printf("Requesting that MSAA not be available\n");

    glfwWindowHint(GLFW_SAMPLES, samples);
    glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 2);
    glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 0);

    window = glfwCreateWindow(800, 400, "Aliasing Detector", NULL, NULL);
    if (!window)
    {
        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    glfwSetKeyCallback(window, key_callback);

    glfwMakeContextCurrent(window);
    gladLoadGL(glfwGetProcAddress);
    glfwSwapInterval(1);

    glGetIntegerv(GL_SAMPLES, &samples);
    if (samples)
        printf("Context reports MSAA is available with %i samples\n", samples);
    else
        printf("Context reports MSAA is unavailable\n");

    glGenBuffers(1, &vertex_buffer);
    glBindBuffer(GL_ARRAY_BUFFER, vertex_buffer);
    glBufferData(GL_ARRAY_BUFFER, sizeof(vertices), vertices, GL_STATIC_DRAW);

    vertex_shader = glCreateShader(GL_VERTEX_SHADER);
    glShaderSource(vertex_shader, 1, &vertex_shader_text, NULL);
    glCompileShader(vertex_shader);

    fragment_shader = glCreateShader(GL_FRAGMENT_SHADER);
    glShaderSource(fragment_shader, 1, &fragment_shader_text, NULL);
    glCompileShader(fragment_shader);

    program = glCreateProgram();
    glAttachShader(program, vertex_shader);
    glAttachShader(program, fragment_shader);
    glLinkProgram(program);

    mvp_location = glGetUniformLocation(program, "MVP");
    vpos_location = glGetAttribLocation(program, "vPos");

    glEnableVertexAttribArray(vpos_location);
    glVertexAttribPointer(vpos_location, 2, GL_FLOAT, GL_FALSE,
                          sizeof(vertices[0]), (void*) 0);

    while (!glfwWindowShouldClose(window))
    {
        float ratio;
        int width, height;
        mat4x4 m, p, mvp;
        const double angle = glfwGetTime() * M_PI / 180.0;

        glfwGetFramebufferSize(window, &width, &height);
        ratio = width / (float) height;

        glViewport(0, 0, width, height);
        glClear(GL_COLOR_BUFFER_BIT);

        glUseProgram(program);

        mat4x4_ortho(p, -ratio, ratio, -1.f, 1.f, 0.f, 1.f);

        mat4x4_translate(m, -1.f, 0.f, 0.f);
        mat4x4_rotate_Z(m, m, (float) angle);
        mat4x4_mul(mvp, p, m);

        glUniformMatrix4fv(mvp_location, 1, GL_FALSE, (const GLfloat*) mvp);
        glDisable(GL_MULTISAMPLE);
        glDrawArrays(GL_TRIANGLE_FAN, 0, 4);

        mat4x4_translate(m, 1.f, 0.f, 0.f);
        mat4x4_rotate_Z(m, m, (float) angle);
        mat4x4_mul(mvp, p, m);

        glUniformMatrix4fv(mvp_location, 1, GL_FALSE, (const GLfloat*) mvp);
        glEnable(GL_MULTISAMPLE);
        glDrawArrays(GL_TRIANGLE_FAN, 0, 4);

        glfwSwapBuffers(window);
        glfwPollEvents();
    }

    glfwDestroyWindow(window);

    glfwTerminate();
    exit(EXIT_SUCCESS);
}